

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFontGlyph * __thiscall ImFont::FindGlyphNoFallback(ImFont *this,ImWchar c)

{
  ImFontGlyph *pIVar1;
  ulong uVar2;
  undefined2 in_register_00000032;
  
  if ((ulong)CONCAT22(in_register_00000032,c) < (ulong)(long)(this->IndexLookup).Size) {
    uVar2 = (ulong)(this->IndexLookup).Data[CONCAT22(in_register_00000032,c)];
    pIVar1 = (ImFontGlyph *)0x0;
    if (uVar2 != 0xffff) {
      pIVar1 = (this->Glyphs).Data + uVar2;
    }
    return pIVar1;
  }
  return (ImFontGlyph *)0x0;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyphNoFallback(ImWchar c) const
{
    if (c >= (size_t)IndexLookup.Size)
        return NULL;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return NULL;
    return &Glyphs.Data[i];
}